

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Mesh::draw_pick(Mesh *this,int *pickID,bool transformed)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  pointer pFVar5;
  HalfedgeIter *pHVar6;
  pointer pHVar7;
  VertexIter *pVVar8;
  Vertex *e;
  Face *e_00;
  EdgeIter *pEVar9;
  Edge *e_01;
  Halfedge *e_02;
  reference pvVar10;
  pointer pVVar11;
  size_type __n;
  _Self local_208;
  _Self local_200;
  VertexIter v_1;
  int i;
  undefined1 local_1c8 [8];
  Vector3D r2;
  Vector3D q2;
  Vector3D p2;
  Vector3D b2;
  Vector3D a2;
  Vector3D r1;
  Vector3D q1;
  Vector3D p1;
  Vector3D b1;
  Vector3D a1;
  HalfedgeIter h2;
  HalfedgeIter h1;
  HalfedgeIter h;
  Vector3D c;
  _Self local_a0;
  FaceIter f;
  Vector3D local_90;
  double local_78;
  Vector3D local_70;
  _Self local_58;
  _Self local_50;
  VertexIter v;
  undefined1 local_38 [8];
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> originalPositions;
  bool transformed_local;
  int *pickID_local;
  Mesh *this_local;
  
  originalPositions.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = transformed;
  std::
  map<int,_CMU462::HalfedgeElement_*,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::HalfedgeElement_*>_>_>
  ::clear(&this->idToElement);
  if (((this->super_SceneObject).isGhosted & 1U) == 0) {
    std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::vector
              ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)local_38);
    if ((originalPositions.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      glPushMatrix();
      dVar1 = (this->super_SceneObject).position.x;
      dVar2 = (this->super_SceneObject).position.y;
      dVar3 = (this->super_SceneObject).position.z;
      glTranslatef(CONCAT44((int)((ulong)dVar1 >> 0x20),(float)dVar1),
                   CONCAT44((int)((ulong)dVar2 >> 0x20),(float)dVar2),
                   CONCAT44((int)((ulong)dVar3 >> 0x20),(float)dVar3));
      dVar1 = (this->super_SceneObject).rotation.x;
      glRotatef(CONCAT44((int)((ulong)dVar1 >> 0x20),(float)dVar1),0x3f800000,0);
      dVar1 = (this->super_SceneObject).rotation.y;
      glRotatef(CONCAT44((int)((ulong)dVar1 >> 0x20),(float)dVar1),0,0x3f800000);
      dVar1 = (this->super_SceneObject).rotation.z;
      glRotatef(CONCAT44((int)((ulong)dVar1 >> 0x20),(float)dVar1),0,0,0x3f800000);
      dVar1 = (this->super_SceneObject).scale.x;
      dVar2 = (this->super_SceneObject).scale.y;
      dVar3 = (this->super_SceneObject).scale.z;
      glScalef(CONCAT44((int)((ulong)dVar1 >> 0x20),(float)dVar1),
               CONCAT44((int)((ulong)dVar2 >> 0x20),(float)dVar2),
               CONCAT44((int)((ulong)dVar3 >> 0x20),(float)dVar3));
      local_50._M_node = (_List_node_base *)HalfedgeMesh::verticesBegin(&this->mesh);
      while( true ) {
        local_58._M_node = (_List_node_base *)HalfedgeMesh::verticesEnd(&this->mesh);
        bVar4 = std::operator!=(&local_50,&local_58);
        if (!bVar4) break;
        pVVar11 = std::_List_iterator<CMU462::Vertex>::operator->(&local_50);
        std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
                  ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)local_38,
                   &pVVar11->position);
        pVVar11 = std::_List_iterator<CMU462::Vertex>::operator->(&local_50);
        local_78 = (double)pVVar11->offset;
        pVVar11 = std::_List_iterator<CMU462::Vertex>::operator->(&local_50);
        Vertex::normal(&local_90,pVVar11);
        CMU462::operator*(&local_70,&local_78,&local_90);
        pVVar11 = std::_List_iterator<CMU462::Vertex>::operator->(&local_50);
        Vector3D::operator+=(&pVVar11->position,&local_70);
        f._M_node = (_List_node_base *)std::_List_iterator<CMU462::Vertex>::operator++(&local_50,0);
      }
    }
    local_a0._M_node = (_List_node_base *)HalfedgeMesh::facesBegin(&this->mesh);
    while( true ) {
      c.z = (double)HalfedgeMesh::facesEnd(&this->mesh);
      bVar4 = std::operator!=(&local_a0,(_Self *)&c.z);
      if (!bVar4) break;
      pFVar5 = std::_List_iterator<CMU462::Face>::operator->(&local_a0);
      (**(pFVar5->super_HalfedgeElement)._vptr_HalfedgeElement)(&h);
      pFVar5 = std::_List_iterator<CMU462::Face>::operator->(&local_a0);
      pHVar6 = Face::halfedge(pFVar5);
      h1._M_node = pHVar6->_M_node;
      do {
        h2 = h1;
        pHVar7 = std::_List_iterator<CMU462::Halfedge>::operator->(&h1);
        pHVar6 = Halfedge::next(pHVar7);
        a1.z = (double)pHVar6->_M_node;
        Vector3D::Vector3D((Vector3D *)&b1.z);
        Vector3D::Vector3D((Vector3D *)&p1.z);
        Vector3D::Vector3D((Vector3D *)&q1.z);
        Vector3D::Vector3D((Vector3D *)&r1.z);
        Vector3D::Vector3D((Vector3D *)&a2.z);
        Vector3D::Vector3D((Vector3D *)&b2.z);
        Vector3D::Vector3D((Vector3D *)&p2.z);
        Vector3D::Vector3D((Vector3D *)&q2.z);
        Vector3D::Vector3D((Vector3D *)&r2.z);
        Vector3D::Vector3D((Vector3D *)local_1c8);
        pHVar7 = std::_List_iterator<CMU462::Halfedge>::operator->(&h2);
        Halfedge::getPickPoints
                  (pHVar7,(Vector3D *)&b1.z,(Vector3D *)&p1.z,(Vector3D *)&q1.z,(Vector3D *)&r1.z,
                   (Vector3D *)&a2.z);
        pHVar7 = std::_List_iterator<CMU462::Halfedge>::operator->
                           ((_List_iterator<CMU462::Halfedge> *)&a1.z);
        Halfedge::getPickPoints
                  (pHVar7,(Vector3D *)&b2.z,(Vector3D *)&p2.z,(Vector3D *)&q2.z,(Vector3D *)&r2.z,
                   (Vector3D *)local_1c8);
        glBegin(4);
        pHVar7 = std::_List_iterator<CMU462::Halfedge>::operator->
                           ((_List_iterator<CMU462::Halfedge> *)&a1.z);
        pVVar8 = Halfedge::vertex(pHVar7);
        e = elementAddress(pVVar8->_M_node);
        newPickElement(this,pickID,&e->super_HalfedgeElement);
        glVertex3dv(&b1.z);
        glVertex3dv(&q1.z);
        glVertex3dv(&a2.z);
        e_00 = elementAddress((FaceIter)local_a0._M_node);
        newPickElement(this,pickID,&e_00->super_HalfedgeElement);
        glVertex3dv(&p1.z);
        glVertex3dv(&p2.z);
        glVertex3dv(&h);
        glEnd();
        glBegin(7);
        pHVar7 = std::_List_iterator<CMU462::Halfedge>::operator->
                           ((_List_iterator<CMU462::Halfedge> *)&a1.z);
        pEVar9 = Halfedge::edge(pHVar7);
        e_01 = elementAddress(pEVar9->_M_node);
        newPickElement(this,pickID,&e_01->super_HalfedgeElement);
        glVertex3dv(&q1.z);
        glVertex3dv(local_1c8);
        glVertex3dv(&r2.z);
        glVertex3dv(&r1.z);
        e_02 = elementAddress((HalfedgeIter)a1.z);
        newPickElement(this,pickID,&e_02->super_HalfedgeElement);
        glVertex3dv(&r1.z);
        glVertex3dv(&r2.z);
        glVertex3dv(&p2.z);
        glVertex3dv(&p1.z);
        glEnd();
        pHVar7 = std::_List_iterator<CMU462::Halfedge>::operator->(&h1);
        pHVar6 = Halfedge::next(pHVar7);
        h1._M_node = pHVar6->_M_node;
        pFVar5 = std::_List_iterator<CMU462::Face>::operator->(&local_a0);
        pHVar6 = Face::halfedge(pFVar5);
        bVar4 = std::operator!=(&h1,pHVar6);
      } while (bVar4);
      std::_List_iterator<CMU462::Face>::operator++(&local_a0,0);
    }
    if ((originalPositions.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      glPopMatrix();
      v_1._M_node._4_4_ = 0;
      local_200._M_node = (_List_node_base *)HalfedgeMesh::verticesBegin(&this->mesh);
      while( true ) {
        local_208._M_node = (_List_node_base *)HalfedgeMesh::verticesEnd(&this->mesh);
        bVar4 = std::operator!=(&local_200,&local_208);
        if (!bVar4) break;
        __n = (size_type)v_1._M_node._4_4_;
        v_1._M_node._4_4_ = v_1._M_node._4_4_ + 1;
        pvVar10 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                            ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)local_38
                             ,__n);
        pVVar11 = std::_List_iterator<CMU462::Vertex>::operator->(&local_200);
        (pVVar11->position).x = pvVar10->x;
        (pVVar11->position).y = pvVar10->y;
        (pVVar11->position).z = pvVar10->z;
        std::_List_iterator<CMU462::Vertex>::operator++(&local_200,0);
      }
    }
    std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::~vector
              ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)local_38);
  }
  return;
}

Assistant:

void Mesh::draw_pick( int& pickID, bool transformed )
{
   idToElement.clear();
   if (isGhosted) return;
   vector<Vector3D> originalPositions;

   if (transformed) {
     glPushMatrix();
     glTranslatef(position.x, position.y, position.z);
     glRotatef(rotation.x, 1.0f, 0.0f, 0.0f);
     glRotatef(rotation.y, 0.0f, 1.0f, 0.0f);
     glRotatef(rotation.z, 0.0f, 0.0f, 1.0f);
     glScalef(scale.x, scale.y, scale.z);
     for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
       originalPositions.push_back(v->position);
       v->position += v->offset * v->normal();
     }
   }

   for( FaceIter f = mesh.facesBegin(); f != mesh.facesEnd(); f++ )
   {
      Vector3D c = f->centroid();

      HalfedgeIter h = f->halfedge();
      do
      {

         HalfedgeIter h1 = h;
         HalfedgeIter h2 = h->next();

         Vector3D a1, b1, p1, q1, r1;
         Vector3D a2, b2, p2, q2, r2;

         h1->getPickPoints( a1, b1, p1, q1, r1 );
         h2->getPickPoints( a2, b2, p2, q2, r2 );

         glBegin( GL_TRIANGLES );

         // vertex
         newPickElement( pickID, elementAddress(h2->vertex()) );
         glVertex3dv( &a1.x );
         glVertex3dv( &p1.x );
         glVertex3dv( &r1.x );

         // face
         newPickElement( pickID, elementAddress(f) );
         glVertex3dv( &b1.x );
         glVertex3dv( &b2.x );
         glVertex3dv( &c.x );

         glEnd();

         glBegin( GL_QUADS );

         // edge
         newPickElement( pickID, elementAddress(h2->edge()) );
         glVertex3dv( &p1.x );
         glVertex3dv( &r2.x );
         glVertex3dv( &q2.x );
         glVertex3dv( &q1.x );

         // halfedge
         newPickElement( pickID, elementAddress(h2) );
         glVertex3dv( &q1.x );
         glVertex3dv( &q2.x );
         glVertex3dv( &b2.x );
         glVertex3dv( &b1.x );

         glEnd();

         h = h->next();
      }
      while( h != f->halfedge() );
   }

   if (transformed) {
     glPopMatrix();
     int i = 0;
     for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
       v->position = originalPositions[i++];
     }
   }
}